

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool ON_IsUTF8Encoded(bool bSloppy,char *buffer,int buffer_length)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int sUTF8_count;
  undefined7 in_register_00000039;
  uint uVar5;
  ON__UINT32 local_44;
  ON_UnicodeErrorParameters local_40;
  
  uVar1 = ON_UnicodeErrorParameters::MaskErrors._0_8_;
  sUTF8_count = (int)buffer;
  bVar4 = sUTF8_count < 1;
  if (0 < sUTF8_count) {
    local_40._0_8_ = ON_UnicodeErrorParameters::MaskErrors._0_8_;
    local_40.m_error_code_point = 0x110000;
    local_44 = 0x110000;
    iVar2 = ON_DecodeUTF8((char *)CONCAT71(in_register_00000039,bSloppy),sUTF8_count,&local_40,
                          &local_44);
    if (0 < iVar2) {
      uVar5 = 0;
      while (iVar3 = ON_IsValidUnicodeCodePoint(local_44), iVar3 != 0) {
        uVar5 = uVar5 + iVar2;
        iVar2 = sUTF8_count - uVar5;
        if (sUTF8_count < (int)uVar5) {
          return bVar4;
        }
        bVar4 = iVar2 == 0 || sUTF8_count < (int)uVar5;
        if (iVar2 == 0 || sUTF8_count < (int)uVar5) {
          return bVar4;
        }
        local_40._0_8_ = uVar1;
        local_40.m_error_code_point = 0x110000;
        local_44 = 0x110000;
        iVar2 = ON_DecodeUTF8((char *)CONCAT71(in_register_00000039,bSloppy) + uVar5,iVar2,&local_40
                              ,&local_44);
        if (iVar2 < 1) {
          return bVar4;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

static bool ON_IsUTF8Encoded(bool bSloppy, const char* buffer, int buffer_length)
{
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return false;

  struct ON_UnicodeErrorParameters e0
    = bSloppy
    ? ON_UnicodeErrorParameters::FailOnErrors
    : ON_UnicodeErrorParameters::MaskErrors;
  e0.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
  ON__UINT32 unicode_code_point;
  int delta_i = 0;
  for (int i = 0; i < buffer_length; i += (delta_i > 0) ? delta_i : 1)
  {
    struct ON_UnicodeErrorParameters e = e0;
    unicode_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta_i = ON_DecodeUTF8(buffer + i, buffer_length - i, &e, &unicode_code_point);
    if (delta_i > 0 && ON_IsValidUnicodeCodePoint(unicode_code_point) && i + delta_i <= buffer_length)
      continue;
    return false;
  }

  return true;
}